

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::DirectoryRecord::print<std::back_insert_iterator<std::__cxx11::string>>
          (DirectoryRecord *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  int local_5c;
  int local_58;
  int local_54;
  _Head_base<3UL,_long,_false> local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = (this->
             super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
             super__Head_base<0UL,_long,_false>._M_head_impl;
  local_40 = (this->
             super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>.
             _M_head_impl;
  local_48 = (this->
             super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
             super__Head_base<2UL,_long,_false>._M_head_impl;
  local_50._M_head_impl =
       (this->
       super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  local_5c = MAT;
  local_58 = MT;
  local_54 = MF;
  tools::disco::Integer<33u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
            (&local_38,it);
  tools::disco::
  Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,int,int,int>
            (it,&local_40,&local_48,&local_50._M_head_impl,&local_5c,&local_54,&local_58);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;
  using Format = disco::Record< disco::Integer< 33 >, disco::Integer< 11 >,
                                disco::Integer< 11 >, disco::Integer< 11 >,
                                disco::Integer< 4 >, disco::Integer< 2 >,
                                disco::Integer< 3 >, disco::Column<5> >;
  Format::write( it, this->MF(), this->MT(),
                 this->NC(), this->MOD(), MAT, MF, MT );
}